

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall
llvm::detail::IEEEFloat::makeNaN(IEEEFloat *this,bool SNaN,bool Negative,APInt *fill)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Significand *dst;
  uint uVar4;
  
  this->field_0x12 = (Negative << 3 | this->field_0x12 & 0xf0) + 1;
  uVar4 = this->semantics->precision;
  if (uVar4 - 0x40 < 0xffffff80) {
    dst = (Significand *)(this->significand).parts;
  }
  else {
    dst = &this->significand;
  }
  uVar4 = uVar4 + 0x40 >> 6;
  if (fill == (APInt *)0x0) {
    APInt::tcSet(&dst->part,0,uVar4);
    uVar3 = this->semantics->precision;
  }
  else {
    uVar3 = fill->BitWidth;
    uVar2 = (uint)((ulong)uVar3 + 0x3f >> 6);
    if (uVar2 < uVar4) {
      APInt::tcSet(&dst->part,0,uVar4);
      uVar3 = fill->BitWidth;
      uVar2 = (uint)((ulong)uVar3 + 0x3f >> 6);
    }
    if (0x40 < uVar3) {
      fill = (APInt *)(fill->U).pVal;
    }
    if (uVar4 < uVar2) {
      uVar2 = uVar4;
    }
    APInt::tcAssign(&dst->part,(WordType *)fill,uVar2);
    uVar3 = this->semantics->precision;
    uVar2 = uVar3 - 1 >> 6;
    dst[uVar2].part = dst[uVar2].part & ~(-1L << ((byte)(uVar3 - 1) & 0x3f));
    while (uVar2 = uVar2 + 1, uVar2 != uVar4) {
      dst[uVar2].part = 0;
    }
  }
  uVar2 = uVar3 - 2;
  if (SNaN) {
    APInt::tcClearBit(&dst->part,uVar2);
    bVar1 = APInt::tcIsZero(&dst->part,uVar4);
    if (!bVar1) goto LAB_0018cdd7;
    uVar2 = uVar3 - 3;
  }
  APInt::tcSetBit(&dst->part,uVar2);
LAB_0018cdd7:
  if (this->semantics != (fltSemantics *)semX87DoubleExtended) {
    return;
  }
  APInt::tcSetBit(&dst->part,uVar3 - 1);
  return;
}

Assistant:

void IEEEFloat::makeNaN(bool SNaN, bool Negative, const APInt *fill) {
  category = fcNaN;
  sign = Negative;

  integerPart *significand = significandParts();
  unsigned numParts = partCount();

  // Set the significand bits to the fill.
  if (!fill || fill->getNumWords() < numParts)
    APInt::tcSet(significand, 0, numParts);
  if (fill) {
    APInt::tcAssign(significand, fill->getRawData(),
                    std::min(fill->getNumWords(), numParts));

    // Zero out the excess bits of the significand.
    unsigned bitsToPreserve = semantics->precision - 1;
    unsigned part = bitsToPreserve / 64;
    bitsToPreserve %= 64;
    significand[part] &= ((1ULL << bitsToPreserve) - 1);
    for (part++; part != numParts; ++part)
      significand[part] = 0;
  }

  unsigned QNaNBit = semantics->precision - 2;

  if (SNaN) {
    // We always have to clear the QNaN bit to make it an SNaN.
    APInt::tcClearBit(significand, QNaNBit);

    // If there are no bits set in the payload, we have to set
    // *something* to make it a NaN instead of an infinity;
    // conventionally, this is the next bit down from the QNaN bit.
    if (APInt::tcIsZero(significand, numParts))
      APInt::tcSetBit(significand, QNaNBit - 1);
  } else {
    // We always have to set the QNaN bit to make it a QNaN.
    APInt::tcSetBit(significand, QNaNBit);
  }

  // For x87 extended precision, we want to make a NaN, not a
  // pseudo-NaN.  Maybe we should expose the ability to make
  // pseudo-NaNs?
  if (semantics == &semX87DoubleExtended)
    APInt::tcSetBit(significand, QNaNBit + 1);
}